

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

string * __thiscall pbrt::TriangleMesh::ToString_abi_cxx11_(TriangleMesh *this)

{
  bool *in_RSI;
  string *in_RDI;
  span<const_pbrt::Vector3<float>_> sVar1;
  span<const_int> sVar2;
  string np;
  size_t in_stack_fffffffffffffe28;
  Normal3<float> *in_stack_fffffffffffffe30;
  span<const_pbrt::Normal3<float>_> *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  allocator<char> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  string *args_2;
  allocator<char> *args;
  int *in_stack_fffffffffffffe98;
  string local_158 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  string local_f8 [32];
  span<const_pbrt::Normal3<float>_> local_d8;
  string local_c8 [32];
  span<const_pbrt::Point3<float>_> local_a8;
  string local_98 [32];
  span<const_int> local_78;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [48];
  
  args = &local_31;
  args_2 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  std::allocator<char>::~allocator(&local_31);
  if (*(long *)(in_RSI + 8) == 0) {
    std::__cxx11::string::string(local_68,local_30);
  }
  else {
    local_78 = pstd::MakeSpan<const_int>((int *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28)
    ;
    StringPrintf<pstd::span<int_const>>
              (in_stack_fffffffffffffe58,(span<const_int> *)in_stack_fffffffffffffe50);
  }
  if (*(long *)(in_RSI + 0x10) == 0) {
    std::__cxx11::string::string(local_98,local_30);
  }
  else {
    local_a8 = pstd::MakeSpan<const_pbrt::Point3<float>_>
                         ((Point3<float> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    StringPrintf<pstd::span<pbrt::Point3<float>const>>
              (in_stack_fffffffffffffe58,
               (span<const_pbrt::Point3<float>_> *)in_stack_fffffffffffffe50);
  }
  if (*(long *)(in_RSI + 0x18) == 0) {
    std::__cxx11::string::string(local_c8,local_30);
  }
  else {
    local_d8 = pstd::MakeSpan<const_pbrt::Normal3<float>_>
                         (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    StringPrintf<pstd::span<pbrt::Normal3<float>const>>
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  }
  if (*(long *)(in_RSI + 0x20) == 0) {
    std::__cxx11::string::string(local_f8,local_30);
  }
  else {
    sVar1 = pstd::MakeSpan<const_pbrt::Vector3<float>_>
                      ((Vector3<float> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    in_stack_fffffffffffffef8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar1.ptr;
    StringPrintf<pstd::span<pbrt::Vector3<float>const>>
              (in_stack_fffffffffffffe58,
               (span<const_pbrt::Vector3<float>_> *)in_stack_fffffffffffffe50);
  }
  if (*(long *)(in_RSI + 0x28) == 0) {
    std::__cxx11::string::string((string *)&stack0xfffffffffffffed8,local_30);
  }
  else {
    join_0x00000010_0x00000000_ =
         pstd::MakeSpan<const_pbrt::Point2<float>_>
                   ((Point2<float> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    StringPrintf<pstd::span<pbrt::Point2<float>const>>
              (in_stack_fffffffffffffe58,
               (span<const_pbrt::Point2<float>_> *)in_stack_fffffffffffffe50);
  }
  if (*(long *)(in_RSI + 0x30) == 0) {
    std::__cxx11::string::string(local_158,local_30);
  }
  else {
    sVar2 = pstd::MakeSpan<const_int>((int *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    in_stack_fffffffffffffe98 = sVar2.ptr;
    StringPrintf<pstd::span<int_const>>
              (in_stack_fffffffffffffe58,(span<const_int> *)in_stack_fffffffffffffe50);
  }
  StringPrintf<bool_const&,bool_const&,int_const&,int_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            ((char *)in_stack_fffffffffffffe98,(bool *)args,in_RSI,(int *)args_2,(int *)in_RDI,
             local_158._40_8_,in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffee8,in_stack_fffffffffffffef0,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return args_2;
}

Assistant:

std::string TriangleMesh::ToString() const {
    std::string np = "(nullptr)";
    return StringPrintf(
        "[ TriangleMesh reverseOrientation: %s transformSwapsHandedness: %s "
        "nTriangles: %d nVertices: %d vertexIndices: %s p: %s n: %s "
        "s: %s uv: %s faceIndices: %s ]",
        reverseOrientation, transformSwapsHandedness, nTriangles, nVertices,
        vertexIndices ? StringPrintf("%s", pstd::MakeSpan(vertexIndices, 3 * nTriangles))
                      : np,
        p ? StringPrintf("%s", pstd::MakeSpan(p, nVertices)) : np,
        n ? StringPrintf("%s", pstd::MakeSpan(n, nVertices)) : np,
        s ? StringPrintf("%s", pstd::MakeSpan(s, nVertices)) : np,
        uv ? StringPrintf("%s", pstd::MakeSpan(uv, nVertices)) : np,
        faceIndices ? StringPrintf("%s", pstd::MakeSpan(faceIndices, nTriangles)) : np);
}